

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O2

int dwarf_dnames_bucket(Dwarf_Dnames_Head dn,Dwarf_Unsigned bucket_number,Dwarf_Unsigned *name_index
                       ,Dwarf_Unsigned *collision_count,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  Dwarf_Unsigned *pDVar2;
  int iVar3;
  Dwarf_DN_Bucket_s *pDVar4;
  char *msg;
  Dwarf_Unsigned DVar5;
  ulong uVar6;
  Dwarf_Signed errval;
  Dwarf_Unsigned DVar7;
  ulong uVar8;
  Dwarf_Debug dbg;
  Dwarf_DN_Bucket_s *pDVar9;
  ulong __nmemb;
  long lVar10;
  undefined8 local_48;
  Dwarf_Unsigned *local_40;
  Dwarf_Unsigned *local_38;
  
  if ((dn == (Dwarf_Dnames_Head)0x0) || (dn->dn_magic != 0xabcd)) {
    msg = "DW_DLE_DBG_NULL: bad Head argument to dwarf_dnames_bucket";
    errval = 0x51;
    dbg = (Dwarf_Debug)0x0;
LAB_001aea14:
    _dwarf_error_string(dbg,error,errval,msg);
    iVar3 = 1;
  }
  else {
    __nmemb = dn->dn_bucket_count;
    if (__nmemb <= bucket_number) {
      return -1;
    }
    pDVar4 = dn->dn_bucket_array;
    if (pDVar4 == (Dwarf_DN_Bucket_s *)0x0) {
      dbg = dn->dn_dbg;
      pDVar4 = (Dwarf_DN_Bucket_s *)calloc(__nmemb,0x10);
      dn->dn_bucket_array = pDVar4;
      if (pDVar4 == (Dwarf_DN_Bucket_s *)0x0) {
        msg = "DW_DLE_ALLOC_FAIL: .debug_names bucket array could not be allocated";
        errval = 0x3e;
        goto LAB_001aea14;
      }
      lVar10 = 0;
      local_40 = name_index;
      local_38 = collision_count;
      for (uVar8 = 0; uVar8 < __nmemb; uVar8 = uVar8 + 1) {
        pDVar1 = dn->dn_buckets;
        local_48 = 0;
        if (pDVar1 + __nmemb * 4 < pDVar1 + lVar10 + 4) {
          msg = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
          errval = 0x14b;
          goto LAB_001aea14;
        }
        (*dbg->de_copy_word)(&local_48,pDVar1 + lVar10,4);
        pDVar4 = dn->dn_bucket_array;
        *(undefined8 *)((long)&pDVar4->db_nameindex + lVar10 * 4) = local_48;
        __nmemb = dn->dn_bucket_count;
        lVar10 = lVar10 + 4;
      }
      uVar8 = 0;
      while (collision_count = local_38, name_index = local_40, uVar8 < __nmemb) {
        DVar5 = pDVar4[uVar8].db_nameindex;
        if (DVar5 == 0) {
          uVar8 = uVar8 + 1;
        }
        else {
          pDVar9 = pDVar4 + uVar8 + 1;
          uVar6 = uVar8;
          do {
            uVar6 = uVar6 + 1;
            if (__nmemb <= uVar6) {
              DVar5 = dn->dn_name_count - DVar5;
              DVar7 = 1;
              if (DVar5 != 0) {
                DVar7 = DVar5;
              }
              pDVar4[uVar8].db_collisioncount = DVar7;
              goto LAB_001ae9f1;
            }
            pDVar2 = &pDVar9->db_nameindex;
            pDVar9 = pDVar9 + 1;
          } while (*pDVar2 == 0);
          pDVar4[uVar8].db_collisioncount = *pDVar2 - DVar5;
          uVar8 = uVar6;
        }
      }
    }
LAB_001ae9f1:
    *name_index = pDVar4[bucket_number].db_nameindex;
    *collision_count = pDVar4[bucket_number].db_collisioncount;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
dwarf_dnames_bucket(Dwarf_Dnames_Head dn,
    Dwarf_Unsigned      bucket_number,
    Dwarf_Unsigned    * name_index,
    Dwarf_Unsigned    * collision_count,
    Dwarf_Error *       error)
{
    struct Dwarf_DN_Bucket_s *cur = 0;
    int res = 0;

    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: bad Head argument to "
            "dwarf_dnames_bucket");
        return DW_DLV_ERROR;
    }
    if (bucket_number >= dn->dn_bucket_count) {
        return DW_DLV_NO_ENTRY;
    }
    res  = _dwarf_initialize_bucket_details(dn,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (!dn->dn_bucket_array) {
        return DW_DLV_NO_ENTRY;
    }
    cur = dn->dn_bucket_array + bucket_number;
    *name_index = cur->db_nameindex;
    *collision_count = cur->db_collisioncount;
    return DW_DLV_OK;
}